

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O3

void __thiscall QMarkdownTextEdit::openUrl(QMarkdownTextEdit *this,QString *urlString)

{
  QDebug QVar1;
  char16_t *pcVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebug local_50;
  QArrayData *local_48 [3];
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  char *local_18;
  
  local_30 = 2;
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0;
  local_18 = "default";
  QMessageLogger::debug();
  QVar1.stream = local_50.stream;
  QVar3.m_data = (storage_type *)0x12;
  QVar3.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_50.stream,' ');
  }
  QVar1.stream = local_50.stream;
  QVar4.m_data = (storage_type *)0x7;
  QVar4.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_50.stream,' ');
  }
  QVar1.stream = local_50.stream;
  QVar5.m_data = (storage_type *)0x10;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,8);
    }
  }
  if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_50.stream,' ');
  }
  pcVar2 = (urlString->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)&local_50,(ulong)pcVar2);
  if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_50.stream,' ');
  }
  QDebug::~QDebug(&local_50);
  QUrl::QUrl((QUrl *)&local_30,urlString,0);
  QDesktopServices::openUrl((QUrl *)&local_30);
  QUrl::~QUrl((QUrl *)&local_30);
  return;
}

Assistant:

void QMarkdownTextEdit::openUrl(const QString &urlString) {
    qDebug() << "QMarkdownTextEdit " << __func__
             << " - 'urlString': " << urlString;

    QDesktopServices::openUrl(QUrl(urlString));
}